

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# column_data_collection.cpp
# Opt level: O2

bool duckdb::ColumnDataCollection::ResultEquals
               (ColumnDataCollection *left,ColumnDataCollection *right,string *error_message,
               bool ordered)

{
  bool bVar1;
  iterator __it;
  undefined4 uVar2;
  undefined7 in_register_00000009;
  idx_t r;
  ulong uVar3;
  ulong uVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *params_1;
  uint uVar5;
  undefined4 in_stack_fffffffffffffd5c;
  string local_290;
  string local_270;
  string local_250 [32];
  Value rvalue;
  Value lvalue;
  string local_1b0;
  ColumnDataRowCollection right_rows;
  ColumnDataRowCollection left_rows;
  
  if (((long)(left->types).super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
             super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
             super__Vector_impl_data._M_finish -
       (long)(left->types).super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
             super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
             super__Vector_impl_data._M_start !=
       (long)(right->types).super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
             super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
             super__Vector_impl_data._M_finish -
       (long)(right->types).super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
             super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
             super__Vector_impl_data._M_start) || (left->count != right->count)) {
    ::std::__cxx11::string::assign((char *)error_message);
    return false;
  }
  uVar2 = (undefined4)CONCAT71(in_register_00000009,ordered);
  ColumnDataRowCollection::ColumnDataRowCollection(&left_rows,left);
  ColumnDataRowCollection::ColumnDataRowCollection(&right_rows,right);
  params_1 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  do {
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)left->count <= params_1
       ) {
      if (error_message->_M_string_length != 0) goto LAB_016bdb8b;
      goto LAB_016bdcc3;
    }
    for (uVar3 = 0;
        uVar3 < (ulong)(((long)(left->types).
                               super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>
                               .
                               super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>
                               ._M_impl.super__Vector_impl_data._M_finish -
                        (long)(left->types).
                              super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>
                              .
                              super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>
                              ._M_impl.super__Vector_impl_data._M_start) / 0x18); uVar3 = uVar3 + 1)
    {
      ColumnDataRowCollection::GetValue(&lvalue,&left_rows,uVar3,(idx_t)params_1);
      ColumnDataRowCollection::GetValue(&rvalue,&right_rows,uVar3,(idx_t)params_1);
      bVar1 = Value::DefaultValuesAreEqual(&lvalue,&rvalue);
      if (!bVar1) {
        ::std::__cxx11::string::string
                  (local_250,"%s <> %s (row: %lld, col: %lld)\n",
                   (allocator *)&stack0xfffffffffffffd5f);
        Value::ToString_abi_cxx11_(&local_270,&lvalue);
        Value::ToString_abi_cxx11_(&local_290,&rvalue);
        StringUtil::Format<std::__cxx11::string,std::__cxx11::string,unsigned_long,unsigned_long>
                  (&local_1b0,(StringUtil *)local_250,&local_270,&local_290,params_1,uVar3,
                   CONCAT44(in_stack_fffffffffffffd5c,uVar2));
        ::std::__cxx11::string::operator=((string *)error_message,(string *)&local_1b0);
        ::std::__cxx11::string::~string((string *)&local_1b0);
        ::std::__cxx11::string::~string((string *)&local_290);
        ::std::__cxx11::string::~string((string *)&local_270);
        ::std::__cxx11::string::~string(local_250);
        Value::~Value(&rvalue);
        Value::~Value(&lvalue);
        break;
      }
      Value::~Value(&rvalue);
      Value::~Value(&lvalue);
    }
    params_1 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               ((long)&(params_1->_M_dataplus)._M_p + 1);
  } while (error_message->_M_string_length == 0);
  if ((char)uVar2 == '\0') {
LAB_016bdb8b:
    uVar5 = 1;
    uVar3 = 0;
    do {
      if ((ulong)(((long)(left->types).
                         super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                         super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>
                         ._M_impl.super__Vector_impl_data._M_finish -
                  (long)(left->types).
                        super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                        super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>
                        ._M_impl.super__Vector_impl_data._M_start) / 0x18) <= uVar3) break;
      rvalue.type_._0_8_ = &rvalue.value_info_;
      rvalue.type_.type_info_.internal.
      super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)0x1;
      rvalue.type_.type_info_.internal.
      super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      rvalue.is_null = false;
      rvalue._25_7_ = 0;
      rvalue.value_.integer = 0x3f800000;
      rvalue.value_.hugeint.upper = 0;
      rvalue.value_info_.internal.
      super___shared_ptr<duckdb::ExtraValueInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)0x0;
      for (uVar4 = 0; uVar4 < left->count; uVar4 = uVar4 + 1) {
        ColumnDataRowCollection::GetValue(&lvalue,&left_rows,uVar3,uVar4);
        ::std::__detail::
        _Insert_base<duckdb::Value,_duckdb::Value,_std::allocator<duckdb::Value>,_std::__detail::_Identity,_duckdb::ValueResultEquals,_duckdb::ValueHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_false>_>
        ::insert((_Insert_base<duckdb::Value,_duckdb::Value,_std::allocator<duckdb::Value>,_std::__detail::_Identity,_duckdb::ValueResultEquals,_duckdb::ValueHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_false>_>
                  *)&rvalue,&lvalue);
        Value::~Value(&lvalue);
      }
      uVar4 = 0;
      do {
        if (right->count <= uVar4) break;
        ColumnDataRowCollection::GetValue(&lvalue,&right_rows,uVar3,uVar4);
        __it = ::std::
               _Hashtable<duckdb::Value,_duckdb::Value,_std::allocator<duckdb::Value>,_std::__detail::_Identity,_duckdb::ValueResultEquals,_duckdb::ValueHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_false>_>
               ::find((_Hashtable<duckdb::Value,_duckdb::Value,_std::allocator<duckdb::Value>,_std::__detail::_Identity,_duckdb::ValueResultEquals,_duckdb::ValueHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_false>_>
                       *)&rvalue,&lvalue);
        if (__it.super__Node_iterator_base<duckdb::Value,_true>._M_cur == (__node_type *)0x0) {
          uVar5 = 0;
        }
        else {
          ::std::
          _Hashtable<duckdb::Value,_duckdb::Value,_std::allocator<duckdb::Value>,_std::__detail::_Identity,_duckdb::ValueResultEquals,_duckdb::ValueHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_false>_>
          ::erase((_Hashtable<duckdb::Value,_duckdb::Value,_std::allocator<duckdb::Value>,_std::__detail::_Identity,_duckdb::ValueResultEquals,_duckdb::ValueHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_false>_>
                   *)&rvalue,
                  (const_iterator)__it.super__Node_iterator_base<duckdb::Value,_true>._M_cur);
        }
        Value::~Value(&lvalue);
        uVar4 = uVar4 + 1;
      } while (__it.super__Node_iterator_base<duckdb::Value,_true>._M_cur != (__node_type *)0x0);
      ::std::
      _Hashtable<duckdb::Value,_duckdb::Value,_std::allocator<duckdb::Value>,_std::__detail::_Identity,_duckdb::ValueResultEquals,_duckdb::ValueHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_false>_>
      ::~_Hashtable((_Hashtable<duckdb::Value,_duckdb::Value,_std::allocator<duckdb::Value>,_std::__detail::_Identity,_duckdb::ValueResultEquals,_duckdb::ValueHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_false>_>
                     *)&rvalue);
      uVar3 = uVar3 + 1;
    } while ((uVar5 & 1) != 0);
    if ((uVar5 & 1) != 0) {
      lvalue.type_._0_8_ =
           &lvalue.type_.type_info_.internal.
            super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
      lvalue.type_.type_info_.internal.
      super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)0x0;
      lvalue.type_.type_info_.internal.
      super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._0_1_
           = 0;
      ::std::__cxx11::string::operator=((string *)error_message,(string *)&lvalue);
      ::std::__cxx11::string::~string((string *)&lvalue);
LAB_016bdcc3:
      bVar1 = true;
      goto LAB_016bdcc9;
    }
  }
  bVar1 = false;
LAB_016bdcc9:
  ColumnDataRowCollection::~ColumnDataRowCollection(&right_rows);
  ColumnDataRowCollection::~ColumnDataRowCollection(&left_rows);
  return bVar1;
}

Assistant:

bool ColumnDataCollection::ResultEquals(const ColumnDataCollection &left, const ColumnDataCollection &right,
                                        string &error_message, bool ordered) {
	if (left.ColumnCount() != right.ColumnCount()) {
		error_message = "Column count mismatch";
		return false;
	}
	if (left.Count() != right.Count()) {
		error_message = "Row count mismatch";
		return false;
	}
	auto left_rows = left.GetRows();
	auto right_rows = right.GetRows();
	for (idx_t r = 0; r < left.Count(); r++) {
		for (idx_t c = 0; c < left.ColumnCount(); c++) {
			auto lvalue = left_rows.GetValue(c, r);
			auto rvalue = right_rows.GetValue(c, r);

			if (!Value::DefaultValuesAreEqual(lvalue, rvalue)) {
				error_message =
				    StringUtil::Format("%s <> %s (row: %lld, col: %lld)\n", lvalue.ToString(), rvalue.ToString(), r, c);
				break;
			}
		}
		if (!error_message.empty()) {
			if (ordered) {
				return false;
			} else {
				break;
			}
		}
	}
	if (!error_message.empty()) {
		// do an unordered comparison
		bool found_all = true;
		for (idx_t c = 0; c < left.ColumnCount(); c++) {
			std::unordered_multiset<Value, ValueHashFunction, ValueResultEquals> lvalues;
			for (idx_t r = 0; r < left.Count(); r++) {
				auto lvalue = left_rows.GetValue(c, r);
				lvalues.insert(lvalue);
			}
			for (idx_t r = 0; r < right.Count(); r++) {
				auto rvalue = right_rows.GetValue(c, r);
				auto entry = lvalues.find(rvalue);
				if (entry == lvalues.end()) {
					found_all = false;
					break;
				}
				lvalues.erase(entry);
			}
			if (!found_all) {
				break;
			}
		}
		if (!found_all) {
			return false;
		}
		error_message = string();
	}
	return true;
}